

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reaction.cpp
# Opt level: O3

void __thiscall BindPolymerase::Execute(BindPolymerase *this)

{
  int iVar1;
  int iVar2;
  SpeciesTracker *pSVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  bool bVar4;
  shared_ptr<Polymerase> new_pol;
  Ptr polymer;
  undefined1 local_49;
  long local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  long local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  undefined1 local_28 [32];
  
  Bind::ChoosePolymer((Bind *)local_28);
  std::__shared_ptr<Polymerase,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<Polymerase>,Polymerase_const&>
            ((__shared_ptr<Polymerase,(__gnu_cxx::_Lock_policy)2> *)&local_48,
             (allocator<Polymerase> *)&local_49,&this->pol_template_);
  local_38 = local_48;
  local_30 = local_40;
  if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_40->_M_use_count = local_40->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_40->_M_use_count = local_40->_M_use_count + 1;
    }
  }
  (**(code **)(*(_func_int **)local_28._0_8_ + 8))
            (local_28._0_8_,&local_38,&(this->super_Bind).promoter_name_);
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
  }
  pSVar3 = SpeciesTracker::Instance();
  local_28._24_8_ = *(_func_int **)(local_28._0_8_ + 0x58);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28._24_8_ ==
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_28._24_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    iVar2 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28._24_8_)->_M_use_count;
    local_28._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    do {
      if (iVar2 == 0) {
        local_28._24_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        goto LAB_0012b4f6;
      }
      LOCK();
      iVar1 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28._24_8_)->_M_use_count;
      bVar4 = iVar2 == iVar1;
      if (bVar4) {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28._24_8_)->_M_use_count = iVar2 + 1;
        iVar1 = iVar2;
      }
      iVar2 = iVar1;
      UNLOCK();
    } while (!bVar4);
    if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28._24_8_)->_M_use_count != 0) {
      local_28._16_8_ = *(_func_int **)(local_28._0_8_ + 0x50);
      goto LAB_0012b4f6;
    }
  }
  local_28._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
LAB_0012b4f6:
  Signal<std::shared_ptr<Reaction>_>::Emit
            (&pSVar3->propensity_signal_,(shared_ptr<Reaction> *)(local_28 + 0x10));
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28._24_8_);
  }
  pSVar3 = SpeciesTracker::Instance();
  SpeciesTracker::Increment(pSVar3,(string *)(local_48 + 0x18),-1);
  if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
  }
  if ((element_type *)local_28._8_8_ != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28._8_8_);
  }
  return;
}

Assistant:

void BindPolymerase::Execute() {
  auto polymer = ChoosePolymer();
  auto new_pol = std::make_shared<Polymerase>(pol_template_);
  polymer->Bind(new_pol, promoter_name_);
  SpeciesTracker::Instance().propensity_signal_.Emit(polymer->wrapper());
  // Polymer should handle decrementing promoter
  SpeciesTracker::Instance().Increment(new_pol->name(), -1);
}